

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtIDebugDraw.h
# Opt level: O1

void __thiscall
cbtIDebugDraw::drawAabb(cbtIDebugDraw *this,cbtVector3 *from,cbtVector3 *to,cbtVector3 *color)

{
  long lVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float local_80 [5];
  float local_6c;
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  float local_58;
  float local_54;
  float local_50;
  undefined4 local_4c;
  float local_48;
  float local_44;
  float local_40;
  undefined4 local_3c;
  long local_38;
  
  fVar2 = (to->m_floats[0] - from->m_floats[0]) * 0.5;
  fVar3 = (to->m_floats[1] - from->m_floats[1]) * 0.5;
  fVar4 = (to->m_floats[2] - from->m_floats[2]) * 0.5;
  local_58 = (to->m_floats[0] + from->m_floats[0]) * 0.5;
  local_54 = (to->m_floats[1] + from->m_floats[1]) * 0.5;
  local_50 = (to->m_floats[2] + from->m_floats[2]) * 0.5;
  local_80[0] = 1.0;
  local_80[1] = 1.0;
  local_80[2] = 1.0;
  local_80[3] = 0.0;
  local_38 = 0;
  local_5c = fVar2;
  local_60 = fVar3;
  local_64 = fVar4;
  local_68 = local_58;
  local_6c = local_54;
  local_80[4] = local_50;
  do {
    lVar1 = 0;
    do {
      local_3c = 0;
      local_48 = local_58 + fVar2 * local_80[0];
      local_44 = local_54 + fVar3 * local_80[1];
      local_40 = local_50 + fVar4 * local_80[2];
      local_80[lVar1] = -local_80[lVar1];
      local_4c = 0;
      local_58 = local_58 + fVar2 * local_80[0];
      local_54 = local_54 + fVar3 * local_80[1];
      local_50 = local_50 + fVar4 * local_80[2];
      (*this->_vptr_cbtIDebugDraw[4])(this,&local_48,&local_58,color);
      fVar2 = local_5c;
      fVar3 = local_60;
      fVar4 = local_64;
      local_58 = local_68;
      local_54 = local_6c;
      local_50 = local_80[4];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
    local_80[0] = -1.0;
    local_80[1] = -1.0;
    local_80[2] = -1.0;
    local_80[3] = 0.0;
    if (local_38 != 3) {
      local_80[local_38] = -local_80[local_38];
    }
    local_38 = local_38 + 1;
  } while (local_38 != 4);
  return;
}

Assistant:

virtual void drawAabb(const cbtVector3& from, const cbtVector3& to, const cbtVector3& color)
	{
		cbtVector3 halfExtents = (to - from) * 0.5f;
		cbtVector3 center = (to + from) * 0.5f;
		int i, j;

		cbtVector3 edgecoord(1.f, 1.f, 1.f), pa, pb;
		for (i = 0; i < 4; i++)
		{
			for (j = 0; j < 3; j++)
			{
				pa = cbtVector3(edgecoord[0] * halfExtents[0], edgecoord[1] * halfExtents[1],
							   edgecoord[2] * halfExtents[2]);
				pa += center;

				int othercoord = j % 3;
				edgecoord[othercoord] *= -1.f;
				pb = cbtVector3(edgecoord[0] * halfExtents[0], edgecoord[1] * halfExtents[1],
							   edgecoord[2] * halfExtents[2]);
				pb += center;

				drawLine(pa, pb, color);
			}
			edgecoord = cbtVector3(-1.f, -1.f, -1.f);
			if (i < 3)
				edgecoord[i] *= -1.f;
		}
	}